

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O2

_Bool AArch64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  byte bVar2;
  cs_detail *__s;
  DecodeStatus DVar3;
  long lVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint16_t uVar7;
  uint8_t *puVar8;
  MCInst *MI;
  uint uVar9;
  uint16_t *Address;
  uint uVar10;
  uint8_t *puVar11;
  uint uVar12;
  uint local_4c;
  DecodeStatus local_48;
  uint local_44;
  MCInst *local_40;
  uint16_t *local_38;
  
  uVar7 = 0;
  DVar3 = MCDisassembler_Fail;
  if (3 < code_len) {
    __s = instr->flat_insn->detail;
    Address = size;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x5f8);
      for (lVar4 = 0x38; lVar4 != 0x1b8; lVar4 = lVar4 + 0x30) {
        puVar8 = instr->flat_insn->detail->regs_read + lVar4;
        puVar8[0] = 0xff;
        puVar8[1] = 0xff;
        puVar8[2] = 0xff;
        puVar8[3] = 0xff;
      }
    }
    if (*(char *)(ud + 0x28) == '\x01') {
      uVar9 = *(uint *)code;
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    }
    else {
      uVar9 = *(uint *)code;
    }
    local_44 = ~uVar9;
    uVar12 = 0;
    local_48 = MCDisassembler_Success;
    puVar8 = DecoderTable32;
    local_40 = instr;
    local_38 = size;
LAB_001647b2:
    puVar11 = puVar8;
    MI = local_40;
    switch(*puVar11) {
    case '\x01':
      bVar1 = puVar11[2];
      local_4c = (uint)bVar1;
      uVar12 = ~(-1 << (bVar1 & 0x1f)) << (puVar11[1] & 0x1f);
      if (bVar1 == 0x20) {
        uVar12 = 0xffffffff;
      }
      uVar12 = (uVar12 & uVar9) >> (puVar11[1] & 0x1f);
      puVar8 = puVar11 + 3;
      goto LAB_001647b2;
    case '\x02':
      uVar5 = decodeULEB128(puVar11 + 1,&local_4c);
      puVar8 = puVar11 + (ulong)local_4c + 3;
      if (uVar12 == (uint)uVar5) goto LAB_001647b2;
      lVar4 = (ulong)local_4c + 1;
      break;
    case '\x03':
      bVar1 = puVar11[1];
      bVar2 = puVar11[2];
      local_4c = (uint)bVar2;
      uVar10 = ~(-1 << (bVar2 & 0x1f)) << (bVar1 & 0x1f);
      if (bVar2 == 0x20) {
        uVar10 = 0xffffffff;
      }
      uVar5 = decodeULEB128(puVar11 + 3,&local_4c);
      puVar8 = puVar11 + (ulong)local_4c + 5;
      if ((uVar10 & uVar9) >> (bVar1 & 0x1f) == (uint)uVar5) goto LAB_001647b2;
      lVar4 = (ulong)local_4c + 3;
      break;
    case '\x04':
      decodeULEB128(puVar11 + 1,&local_4c);
      puVar8 = puVar11 + (ulong)local_4c + 3;
      goto LAB_001647b2;
    case '\x05':
      goto switchD_001647ca_caseD_5;
    case '\x06':
      goto switchD_001647ca_caseD_6;
    default:
      goto switchD_001647ca_default;
    }
    puVar8 = puVar8 + *(ushort *)(puVar11 + lVar4);
    goto LAB_001647b2;
  }
LAB_00164958:
  *size = uVar7;
  return DVar3 == MCDisassembler_Success;
switchD_001647ca_caseD_6:
  uVar5 = decodeULEB128(puVar11 + 1,&local_4c);
  puVar11 = puVar11 + (ulong)local_4c + 1;
  uVar6 = decodeULEB128(puVar11,&local_4c);
  puVar8 = puVar11 + local_4c;
  if (((uint)uVar6 & local_44) != 0 || ((uint)uVar5 & uVar9) != 0) {
    local_48 = MCDisassembler_SoftFail;
  }
  goto LAB_001647b2;
switchD_001647ca_caseD_5:
  uVar5 = decodeULEB128(puVar11 + 1,&local_4c);
  uVar6 = decodeULEB128(puVar11 + (ulong)local_4c + 1,&local_4c);
  MI = local_40;
  MCInst_setOpcode(local_40,(uint)uVar5);
  DVar3 = decodeToMCInst(local_48,(uint)uVar6,uVar9,MI,(uint64_t)Address,(void *)address);
  if (DVar3 == MCDisassembler_Fail) {
switchD_001647ca_default:
    MCInst_clear(MI);
    uVar7 = 0;
    DVar3 = MCDisassembler_Fail;
    size = local_38;
  }
  else {
    uVar7 = 4;
    size = local_38;
  }
  goto LAB_00164958;
}

Assistant:

bool AArch64_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _getInstruction((cs_struct *)ud, instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}